

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::OffsetIndex::write(OffsetIndex *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer pPVar4;
  pointer plVar5;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"OffsetIndex");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"page_locations",0xf,1);
  iVar3 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xc,
                     (ulong)((long)(this->page_locations).
                                   super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                                   .
                                   super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->page_locations).
                                  super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                                  .
                                  super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  iVar3 = iVar2 + iVar1 + iVar3;
  for (pPVar4 = (this->page_locations).
                super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                .
                super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar4 != (this->page_locations).
                super_vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                .
                super__Vector_base<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>
                ._M_impl.super__Vector_impl_data._M_finish; pPVar4 = pPVar4 + 1) {
    iVar1 = (**(code **)(*(long *)pPVar4 + 0x18))(pPVar4,this_00);
    iVar3 = iVar3 + iVar1;
  }
  iVar1 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar1 + iVar3 + iVar2;
  if (((byte)this->__isset & 1) != 0) {
    iVar1 = (*this_00->_vptr_TProtocol[6])(this_00,"unencoded_byte_array_data_bytes",0xf,2);
    iVar3 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->unencoded_byte_array_data_bytes).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->unencoded_byte_array_data_bytes).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar3 = iVar1 + iVar2 + iVar3;
    for (plVar5 = (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        plVar5 != (this->unencoded_byte_array_data_bytes).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish; plVar5 = plVar5 + 1) {
      iVar1 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar5);
      iVar3 = iVar3 + iVar1;
    }
    iVar1 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar1 + iVar3 + iVar2;
  }
  iVar1 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar1 + iVar2 + iVar3);
}

Assistant:

uint32_t OffsetIndex::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("OffsetIndex");

  xfer += oprot->writeFieldBegin("page_locations", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->page_locations.size()));
    duckdb::vector<PageLocation> ::const_iterator _iter170;
    for (_iter170 = this->page_locations.begin(); _iter170 != this->page_locations.end(); ++_iter170)
    {
      xfer += (*_iter170).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  if (this->__isset.unencoded_byte_array_data_bytes) {
    xfer += oprot->writeFieldBegin("unencoded_byte_array_data_bytes", ::apache::thrift::protocol::T_LIST, 2);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->unencoded_byte_array_data_bytes.size()));
      duckdb::vector<int64_t> ::const_iterator _iter171;
      for (_iter171 = this->unencoded_byte_array_data_bytes.begin(); _iter171 != this->unencoded_byte_array_data_bytes.end(); ++_iter171)
      {
        xfer += oprot->writeI64((*_iter171));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}